

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::pareto_dist<long_double>::operator()
          (result_type_conflict3 *__return_storage_ptr__,pareto_dist<long_double> *this,
          lcg64_shift *r)

{
  result_type_conflict3 *prVar1;
  
  utility::u01xx_traits<long_double,_1UL,_trng::lcg64_shift>::oo
            ((longdouble *)this,(lcg64_shift *)this);
  prVar1 = (result_type_conflict3 *)powl();
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return (math::pow(utility::uniformoo<result_type>(r), -1 / P.gamma()) - 1) * P.theta();
    }